

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O1

uint32_t *
createDFD422(int bigEndian,int numSamples,int *bits,int *shiftBits,int *channels,int *position_xs,
            int *position_ys,VkSuffix suffix)

{
  int iVar1;
  ulong uVar2;
  uint32_t *__s;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  if (bigEndian != 0) {
    __assert_fail("!bigEndian",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x194,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  if (suffix != s_UNORM) {
    __assert_fail("suffix == s_UNORM",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x195,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  if (numSamples < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + shiftBits[uVar2] + bits[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)numSamples != uVar2);
  }
  if ((uVar3 & 7) != 0) {
    __assert_fail("totalBits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x19a,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  uVar4 = numSamples * 0x10 + 0x1c;
  __s = (uint32_t *)malloc((ulong)uVar4);
  iVar7 = 0;
  memset(__s,0,(ulong)uVar4);
  *__s = uVar4;
  __s[1] = 0;
  __s[2] = numSamples * 0x100000 + 0x180002;
  __s[3] = 0x10002;
  __s[4] = 1;
  __s[5] = uVar3 >> 3 & 0xff;
  __s[6] = 0;
  if (0 < numSamples) {
    lVar5 = 0;
    do {
      uVar6 = iVar7 + *(int *)((long)shiftBits + lVar5);
      uVar4 = (uint)*(ushort *)((long)__s + lVar5 * 4 + 0x1e) << 0x10;
      uVar3 = uVar6 & 0xffff;
      __s[lVar5 + 7] = uVar4 | uVar3;
      iVar1 = *(int *)((long)bits + lVar5);
      iVar7 = uVar6 + iVar1;
      uVar6 = iVar1 * 0x10000 + 0xff0000U & 0xff0000;
      __s[lVar5 + 7] = uVar4 & 0xff00ffff | uVar3 | uVar6;
      __s[lVar5 + 7] = (*(uint *)((long)channels + lVar5) & 0xf) << 0x18 | uVar3 | uVar6;
      uVar3 = *(uint *)((long)position_xs + lVar5);
      *(char *)(__s + lVar5 + 8) = (char)uVar3;
      __s[lVar5 + 8] = (*(uint *)((long)position_ys + lVar5) & 0xff) << 8 | uVar3 & 0xff;
      __s[lVar5 + 9] = 0;
      __s[lVar5 + 10] = ~(-1 << ((byte)iVar1 & 0x1f));
      lVar5 = lVar5 + 4;
    } while ((ulong)(uint)numSamples << 2 != lVar5);
  }
  return __s;
}

Assistant:

uint32_t *createDFD422(int bigEndian, int numSamples,
                       int bits[], int shiftBits[], int channels[],
                       int position_xs[], int position_ys[],
                       enum VkSuffix suffix) {
    assert(!bigEndian); (void) bigEndian;
    assert(suffix == s_UNORM); (void) suffix;

    int totalBits = 0;
    for (int i = 0; i < numSamples; ++i)
        totalBits += shiftBits[i] + bits[i];
    assert(totalBits % 8 == 0);

    uint32_t BDFDSize = sizeof(uint32_t) * (KHR_DF_WORD_SAMPLESTART + numSamples * KHR_DF_WORD_SAMPLEWORDS);
    uint32_t DFDSize = sizeof(uint32_t) + BDFDSize;
    uint32_t *DFD = (uint32_t *) malloc(DFDSize);
    memset(DFD, 0, DFDSize);
    DFD[0] = DFDSize;
    uint32_t *BDFD = DFD + 1;
    KHR_DFDSETVAL(BDFD, VENDORID, KHR_DF_VENDORID_KHRONOS);
    KHR_DFDSETVAL(BDFD, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
    KHR_DFDSETVAL(BDFD, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
    KHR_DFDSETVAL(BDFD, DESCRIPTORBLOCKSIZE, BDFDSize);
    KHR_DFDSETVAL(BDFD, MODEL, KHR_DF_MODEL_YUVSDA);
    KHR_DFDSETVAL(BDFD, PRIMARIES, KHR_DF_PRIMARIES_UNSPECIFIED);
    KHR_DFDSETVAL(BDFD, TRANSFER, KHR_DF_TRANSFER_LINEAR);
    KHR_DFDSETVAL(BDFD, FLAGS, KHR_DF_FLAG_ALPHA_STRAIGHT);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION0, 2 - 1); // 422 contains 2 x 1 blocks
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION1, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION2, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION3, 1 - 1);
    KHR_DFDSETVAL(BDFD, BYTESPLANE0, totalBits / 8);
    KHR_DFDSETVAL(BDFD, BYTESPLANE1, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE2, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE3, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE4, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE5, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE6, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE7, 0);

    int bitOffset = 0;
    for (int i = 0; i < numSamples; ++i) {
        bitOffset += shiftBits[i];
        KHR_DFDSETSVAL(BDFD, i, BITOFFSET, bitOffset);
        KHR_DFDSETSVAL(BDFD, i, BITLENGTH, bits[i] - 1);
        KHR_DFDSETSVAL(BDFD, i, CHANNELID, channels[i]);
        KHR_DFDSETSVAL(BDFD, i, QUALIFIERS, 0); // None of: FLOAT, SIGNED, EXPONENT, LINEAR
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION0, position_xs[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION1, position_ys[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION2, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION3, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLELOWER, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEUPPER, (1u << bits[i]) - 1u);
        bitOffset += bits[i];
    }

    return DFD;
}